

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

Element __thiscall ftxui::text(ftxui *this,wstring *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Element EVar4;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  to_string(&local_68,text);
  puVar2 = (undefined8 *)operator_new(0x90);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0011fb08;
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_38._8_8_ = local_68.field_2._8_8_;
    local_48 = &local_38;
  }
  else {
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68._M_dataplus._M_p;
  }
  local_38._M_allocated_capacity._1_7_ = local_68.field_2._M_allocated_capacity._1_7_;
  local_38._M_local_buf[0] = local_68.field_2._M_local_buf[0];
  local_40 = local_68._M_string_length;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  Node::Node((Node *)(puVar2 + 2));
  puVar2[2] = &PTR__Text_0011fb58;
  puVar2[0xe] = puVar2 + 0x10;
  if (local_48 == &local_38) {
    puVar2[0x10] = local_38._M_allocated_capacity;
    puVar2[0x11] = local_38._8_8_;
  }
  else {
    puVar2[0xe] = local_48;
    puVar2[0x10] = local_38._M_allocated_capacity;
  }
  puVar2[0xf] = local_40;
  *(Node **)this = (Node *)(puVar2 + 2);
  *(undefined8 **)(this + 8) = puVar2;
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element text(std::wstring text) {  // NOLINT
  return std::make_shared<Text>(to_string(text));
}